

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

RSAPrimeDetails *
setup_rsa_prime(RSAPrimeDetails *__return_storage_ptr__,int bits,_Bool strong,
               PrimeGenerationContext *pgc,ProgressReceiver *prog)

{
  ProgressPhase PVar1;
  ProgressReceiver *prog_local;
  PrimeGenerationContext *pgc_local;
  _Bool strong_local;
  int bits_local;
  
  __return_storage_ptr__->bits = bits;
  pgc_local._3_1_ = strong;
  if (strong) {
    __return_storage_ptr__->bitsm1 = (bits + -0x21) / 2;
    __return_storage_ptr__->bitsp1 = (bits + -0x21) - __return_storage_ptr__->bitsm1;
    __return_storage_ptr__->bitsm1m1 = (__return_storage_ptr__->bitsm1 + -0x21) / 2;
    if (__return_storage_ptr__->bitsm1m1 < 0x21) {
      pgc_local._3_1_ = 0;
    }
  }
  __return_storage_ptr__->strong = (_Bool)(pgc_local._3_1_ & 1);
  if ((__return_storage_ptr__->strong & 1U) != 0) {
    PVar1 = primegen_add_progress_phase(pgc,prog,__return_storage_ptr__->bitsm1m1);
    __return_storage_ptr__->phase_m1m1 = PVar1;
    PVar1 = primegen_add_progress_phase(pgc,prog,__return_storage_ptr__->bitsm1);
    __return_storage_ptr__->phase_m1 = PVar1;
    PVar1 = primegen_add_progress_phase(pgc,prog,__return_storage_ptr__->bitsp1);
    __return_storage_ptr__->phase_p1 = PVar1;
  }
  PVar1 = primegen_add_progress_phase(pgc,prog,__return_storage_ptr__->bits);
  __return_storage_ptr__->phase_main = PVar1;
  return __return_storage_ptr__;
}

Assistant:

static RSAPrimeDetails setup_rsa_prime(
    int bits, bool strong, PrimeGenerationContext *pgc, ProgressReceiver *prog)
{
    RSAPrimeDetails pd;
    pd.bits = bits;
    if (strong) {
        pd.bitsm1 = (bits - STRONG_MARGIN) / 2;
        pd.bitsp1 = (bits - STRONG_MARGIN) - pd.bitsm1;
        pd.bitsm1m1 = (pd.bitsm1 - STRONG_MARGIN) / 2;
        if (pd.bitsm1m1 < STRONG_MARGIN) {
            /* Absurdly small prime, but we should at least not crash. */
            strong = false;
        }
    }
    pd.strong = strong;

    if (pd.strong) {
        pd.phase_m1m1 = primegen_add_progress_phase(pgc, prog, pd.bitsm1m1);
        pd.phase_m1 = primegen_add_progress_phase(pgc, prog, pd.bitsm1);
        pd.phase_p1 = primegen_add_progress_phase(pgc, prog, pd.bitsp1);
    }
    pd.phase_main = primegen_add_progress_phase(pgc, prog, pd.bits);

    return pd;
}